

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_uv_area_sign(REF_GRID ref_grid,REF_INT id,REF_DBL *sign)

{
  double *pdVar1;
  size_t __size;
  REF_GEOM ref_geom;
  REF_CELL ref_cell;
  bool bVar2;
  REF_STATUS RVar3;
  uint uVar4;
  REF_DBL *pRVar5;
  long lVar6;
  int iVar7;
  REF_DBL uv_area;
  REF_INT nodes [27];
  uint local_b8;
  double local_b0;
  REF_INT local_a8 [3];
  int local_9c;
  
  ref_geom = ref_grid->geom;
  if (ref_geom->uv_area_sign != (REF_DBL *)0x0) goto LAB_00143526;
  ref_cell = ref_grid->cell[3];
  if (ref_geom->nface == -1) {
    local_b8 = ref_geom_infer_nedge_nface(ref_grid);
    if (local_b8 == 0) {
      local_b8 = 0;
      goto LAB_00143304;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x117,
           "ref_geom_uv_area_sign",(ulong)local_b8,"infer counts");
    bVar2 = false;
  }
  else {
LAB_00143304:
    iVar7 = ref_geom->nface;
    if ((long)iVar7 < 0) {
      bVar2 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x118,
             "ref_geom_uv_area_sign","malloc ref_geom->uv_area_sign of REF_DBL negative");
      local_b8 = 1;
    }
    else {
      __size = (long)iVar7 * 8;
      pRVar5 = (REF_DBL *)malloc(__size);
      ref_geom->uv_area_sign = pRVar5;
      if (pRVar5 == (REF_DBL *)0x0) {
        bVar2 = false;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x118,"ref_geom_uv_area_sign","malloc ref_geom->uv_area_sign of REF_DBL NULL");
        local_b8 = 2;
      }
      else {
        bVar2 = true;
        if (iVar7 != 0) {
          memset(pRVar5,0,__size);
        }
      }
    }
    if (bVar2) {
      if (0 < ref_cell->max) {
        iVar7 = 0;
        do {
          RVar3 = ref_cell_nodes(ref_cell,iVar7,local_a8);
          if (((RVar3 == 0) && (lVar6 = (long)local_9c, 0 < lVar6)) && (local_9c <= ref_geom->nface)
             ) {
            uVar4 = ref_geom_uv_area(ref_geom,local_a8,&local_b0);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0x11c,"ref_geom_uv_area_sign",(ulong)uVar4,"uv area");
              local_b8 = uVar4;
              bVar2 = false;
              goto LAB_00143522;
            }
            ref_geom->uv_area_sign[lVar6 + -1] =
                 ref_geom->uv_area_sign[lVar6 + -1] +
                 *(double *)(&DAT_00228640 + (ulong)(local_b0 < 0.0) * 8);
          }
          iVar7 = iVar7 + 1;
        } while (iVar7 < ref_cell->max);
      }
      iVar7 = ref_geom->nface;
      bVar2 = true;
      if (0 < (long)iVar7) {
        pRVar5 = ref_geom->uv_area_sign;
        lVar6 = 0;
        do {
          pdVar1 = pRVar5 + lVar6;
          pRVar5[lVar6] =
               *(REF_DBL *)(&DAT_00228640 + (ulong)(*pdVar1 <= 0.0 && *pdVar1 != 0.0) * 8);
          lVar6 = lVar6 + 1;
          bVar2 = true;
        } while (iVar7 != lVar6);
      }
    }
    else {
      bVar2 = false;
    }
  }
LAB_00143522:
  if (!bVar2) {
    return local_b8;
  }
LAB_00143526:
  RVar3 = 3;
  if ((0 < id) && (id <= ref_geom->nface)) {
    *sign = ref_geom->uv_area_sign[(ulong)(uint)id - 1];
    RVar3 = 0;
  }
  return RVar3;
}

Assistant:

REF_FCN REF_STATUS ref_geom_uv_area_sign(REF_GRID ref_grid, REF_INT id,
                                         REF_DBL *sign) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  if (NULL == ((ref_geom)->uv_area_sign)) {
    REF_CELL ref_cell = ref_grid_tri(ref_grid);
    REF_INT face;
    REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
    REF_DBL uv_area;
    if (REF_EMPTY == ref_geom->nface)
      RSS(ref_geom_infer_nedge_nface(ref_grid), "infer counts");
    ref_malloc_init(ref_geom->uv_area_sign, ref_geom->nface, REF_DBL, 0.0);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      face = nodes[3];
      if (face < 1 || ref_geom->nface < face) continue;
      RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area), "uv area");
      if (uv_area < 0.0) {
        ((ref_geom)->uv_area_sign)[face - 1] -= 1.0;
      } else {
        ((ref_geom)->uv_area_sign)[face - 1] += 1.0;
      }
    }
    for (face = 0; face < ref_geom->nface; face++) {
      if (((ref_geom)->uv_area_sign)[face] < 0.0) {
        ((ref_geom)->uv_area_sign)[face] = -1.0;
      } else {
        ((ref_geom)->uv_area_sign)[face] = 1.0;
      }
    }
  }

  if (id < 1 || id > ref_geom->nface) return REF_INVALID;
  *sign = ((ref_geom)->uv_area_sign)[id - 1];

  return REF_SUCCESS;
}